

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O1

void __thiscall runner::runner(runner *this,service *srv)

{
  value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->srv_ = srv;
  (this->command_)._M_dataplus._M_p = (pointer)&(this->command_).field_2;
  (this->command_)._M_string_length = 0;
  (this->command_).field_2._M_local_buf[0] = '\0';
  this_00 = (value *)cppcms::service::settings();
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"none","");
  cppcms::json::value::get<std::__cxx11::string>(&local_40,this_00,"test.exec",&local_60);
  std::__cxx11::string::operator=((string *)&this->command_,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

runner(cppcms::service &srv) : srv_(&srv)
	{
		command_ = srv.settings().get<std::string>("test.exec","none");
	}